

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O0

void __thiscall
ser::CentralizedFileFormat::OpenStreamRead
          (CentralizedFileFormat *this,ifstream *stream,string *fieldName,Savepoint *savepoint)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  offset_t __off;
  fpos<__mbstate_t> local_3f0;
  string local_3e0 [72];
  SerializationException exception;
  ostringstream errorstr;
  SerializationException anon_var_0;
  offset_t offset;
  ostringstream local_1a0 [8];
  ostringstream fname;
  Savepoint *savepoint_local;
  string *fieldName_local;
  ifstream *stream_local;
  CentralizedFileFormat *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,(string *)&(this->super_FileFormat).directory_);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_FileFormat).prefix_);
  poVar2 = std::operator<<(poVar2,"_");
  poVar2 = std::operator<<(poVar2,(string *)fieldName);
  std::operator<<(poVar2,".dat");
  __off = OffsetTable::GetOffset((this->super_FileFormat).pOffsetTable_,savepoint,fieldName);
  std::__cxx11::ostringstream::str();
  _Var1 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)stream,_Var1);
  std::__cxx11::string::~string(local_3e0);
  std::fpos<__mbstate_t>::fpos(&local_3f0,__off);
  std::istream::seekg(stream,local_3f0._M_off,local_3f0._M_state);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void CentralizedFileFormat::OpenStreamRead(std::ifstream& stream, const std::string& fieldName, const Savepoint& savepoint) const
{
    std::ostringstream fname;
    fname << directory_ << "/" << prefix_ << "_" << fieldName << ".dat";

    // Check if field is already saved at savepoint and get offset
    OffsetTable::offset_t offset;
    try {
        offset = pOffsetTable_->GetOffset(savepoint, fieldName);
    }
    catch (SerializationException)
    {
        // Throw more detailed exception
        std::ostringstream errorstr;
        errorstr << "Error: field " << fieldName << " is not saved into serializer "
            << "at savepoint " << savepoint.ToString();
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    stream.open(fname.str().c_str(), std::ios::binary);
    stream.seekg(offset);
}